

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.h
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyz::VariablesQbSetSpeed(ChNodeFEAxyz *this,double step)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  ChVector<double> local_88;
  ChVectorRef local_70;
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_58 [56];
  
  auVar2 = *(undefined1 (*) [16])&this->field_0x38;
  dVar1 = *(double *)&this->field_0x48;
  ChVariables::Get_qb(&local_70,&(this->variables).super_ChVariables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_58,&local_70,0,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&local_88,local_58,(type *)0x0);
  if ((ChVector<double> *)&this->field_0x38 != &local_88) {
    *(double *)&this->field_0x38 = local_88.m_data[0];
    *(double *)&this->field_0x40 = local_88.m_data[1];
    *(double *)&this->field_0x48 = local_88.m_data[2];
  }
  if ((step != 0.0) || (NAN(step))) {
    auVar2 = vsubpd_avx(*(undefined1 (*) [16])&this->field_0x38,auVar2);
    dVar3 = 1.0 / step;
    *(double *)&this->field_0x50 = dVar3 * auVar2._0_8_;
    *(double *)&this->field_0x58 = dVar3 * auVar2._8_8_;
    *(double *)&this->field_0x60 = dVar3 * (*(double *)&this->field_0x48 - dVar1);
  }
  return;
}

Assistant:

virtual void VariablesQbSetSpeed(double step = 0) override {
        ChVector<> old_dt = pos_dt;
        SetPos_dt(variables.Get_qb().segment(0, 3));
        if (step) {
            SetPos_dtdt((pos_dt - old_dt) / step);
        }
    }